

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlNodePtr xmlTextReaderExpand(xmlTextReaderPtr reader)

{
  int iVar1;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    if (reader->doc != (xmlDocPtr)0x0) {
      return reader->node;
    }
    if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
       (iVar1 = xmlTextReaderDoExpand(reader), -1 < iVar1)) {
      return reader->node;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlTextReaderExpand(xmlTextReaderPtr reader) {
    if ((reader == NULL) || (reader->node == NULL))
        return(NULL);
    if (reader->doc != NULL)
        return(reader->node);
    if (reader->ctxt == NULL)
        return(NULL);
    if (xmlTextReaderDoExpand(reader) < 0)
        return(NULL);
    return(reader->node);
}